

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.cxx
# Opt level: O0

void __thiscall Fl_Type::write_comment_h(Fl_Type *this,char *pre)

{
  char *pcVar1;
  char *local_20;
  char *s;
  char *pre_local;
  Fl_Type *this_local;
  
  pcVar1 = comment(this);
  if ((pcVar1 != (char *)0x0) && (pcVar1 = comment(this), *pcVar1 != '\0')) {
    write_h("%s/**\n",pre);
    local_20 = comment(this);
    write_h("%s ",pre);
    for (; *local_20 != '\0'; local_20 = local_20 + 1) {
      if (*local_20 == '\n') {
        if (local_20[1] != '\0') {
          write_h("\n%s ",pre);
        }
      }
      else {
        write_h("%c",(ulong)(uint)(int)*local_20);
      }
    }
    write_h("\n%s*/\n",pre);
  }
  return;
}

Assistant:

void Fl_Type::write_comment_h(const char *pre)
{
  if (comment() && *comment()) {
    write_h("%s/**\n", pre);
    const char *s = comment();
    write_h("%s ", pre);
    while(*s) {
      if (*s=='\n') {
        if (s[1]) {
          write_h("\n%s ", pre);
        }
      } else {
        write_h("%c", *s); // FIXME this is much too slow!
      }
      s++;
    }
    write_h("\n%s*/\n", pre);
  }
}